

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O1

int SUNHashMap_GetValue(SUNHashMap map,char *key,void **value)

{
  uint uVar1;
  SUNHashMapKeyValue *ppSVar2;
  SUNHashMapKeyValue pSVar3;
  SUNHashMapKeyValue pSVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char cVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  
  iVar10 = -1;
  if (value != (void **)0x0 && (key != (char *)0x0 && map != (SUNHashMap)0x0)) {
    uVar9 = 0x100000001b3;
    cVar8 = *key;
    if (cVar8 == '\0') {
      uVar9 = 0x100000001b3;
    }
    else {
      pcVar7 = key + 1;
      do {
        uVar9 = ((long)cVar8 ^ uVar9) * -0x340d631b7bdddcdb;
        cVar8 = *pcVar7;
        pcVar7 = pcVar7 + 1;
      } while (cVar8 != '\0');
    }
    uVar1 = map->max_size;
    ppSVar2 = map->buckets;
    iVar10 = (int)(uVar9 % (ulong)(long)(int)uVar1);
    pSVar3 = ppSVar2[iVar10];
    if (pSVar3 == (SUNHashMapKeyValue)0x0) {
      iVar10 = -2;
    }
    else {
      iVar5 = strcmp(pSVar3->key,key);
      if (iVar5 != 0) {
        iVar10 = iVar10 + 1;
        uVar6 = uVar1;
        if (iVar10 < (int)uVar1) {
          lVar11 = (long)iVar10;
          do {
            pSVar4 = ppSVar2[lVar11];
            if (pSVar4 == (SUNHashMapKeyValue)0x0) {
              uVar6 = 0xffffffff;
            }
            else {
              iVar10 = strcmp(pSVar4->key,key);
              uVar6 = -(uint)(iVar10 != 0) | (uint)lVar11;
            }
          } while ((uVar6 == 0xffffffff) &&
                  (lVar11 = lVar11 + 1, uVar6 = uVar1, lVar11 < (int)uVar1));
        }
        if ((int)uVar6 < 0) {
          return -1;
        }
        if (uVar6 == uVar1) {
          return -2;
        }
      }
      *value = pSVar3->value;
      iVar10 = 0;
    }
  }
  return iVar10;
}

Assistant:

int SUNHashMap_GetValue(SUNHashMap map, const char* key, void** value)
{
  int idx;
  int retval;

  if (map == NULL || key == NULL || value == NULL) { return (-1); }

  /* We want the index to be in (0, map->max_size) */
  idx = (int)(fnv1a_hash(key) % map->max_size);

  /* Check if the key exists */
  if (map->buckets[idx] == NULL) { return (-2); }

  /* Check to see if this is a collision */
  if (strcmp(map->buckets[idx]->key, key))
  {
    /* Keys did not match, so we have a collision and need to probe */
    retval = SUNHashMap_Iterate(map, idx + 1, sunHashMapLinearProbeGet, key);
    if (retval < 0) { return (-1); /* error occurred */ }
    if (retval == map->max_size) { return (-2); /* not found */ }
  }

  /* Return a reference to the value only */
  *value = map->buckets[idx]->value;

  return (0);
}